

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

void csr2dense(CUPDLPdense *dense,CUPDLPcsr *csr)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  
  uVar1 = csr->nRows;
  dense->nRows = uVar1;
  uVar2 = csr->nCols;
  uVar4 = 0;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  dense->nCols = uVar2;
  iVar9 = 0;
  for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
    uVar8 = uVar4;
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      if (uVar5 == (uint)csr->rowMatIdx[iVar9]) {
        *(cupdlp_float *)((long)dense->data + uVar8) = csr->rowMatElem[iVar9];
        iVar9 = iVar9 + 1;
      }
      else {
        *(undefined8 *)((long)dense->data + uVar8) = 0;
      }
      uVar8 = uVar8 + 8;
    }
    uVar4 = uVar4 + (long)(int)uVar2 * 8;
  }
  return;
}

Assistant:

void csr2dense(CUPDLPdense *dense, CUPDLPcsr *csr) {
  dense->nRows = csr->nRows;
  dense->nCols = csr->nCols;

  cupdlp_int iRow = 0;
  cupdlp_int iCol = 0;
  cupdlp_int iMatElem = 0;
  for (iRow = 0; iRow < dense->nRows; ++iRow)
    for (iCol = 0; iCol < dense->nCols; ++iCol) {
      if (iCol == csr->rowMatIdx[iMatElem]) {
        dense->data[iRow * dense->nCols + iCol] = csr->rowMatElem[iMatElem];
        ++iMatElem;
      } else {
        dense->data[iRow * dense->nCols + iCol] = 0;
      }
    }

  return;
}